

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_deflate.cpp
# Opt level: O2

void __thiscall
ktx::CommandDeflate::Options::process
          (Options *this,Options *param_1,ParseResult *args,Reporter *report)

{
  OptionValue *pOVar1;
  bool *pbVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,kQuiet,&local_39);
  pOVar1 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar2 = cxxopts::OptionValue::as<bool>(pOVar1);
  this->quiet = *pbVar2;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,kWarningsAsErrors,&local_39);
  pOVar1 = cxxopts::ParseResult::operator[](args,&local_38);
  pbVar2 = cxxopts::OptionValue::as<bool>(pOVar1);
  this->warningsAsErrors = *pbVar2;
  std::__cxx11::string::~string((string *)&local_38);
  if ((this->quiet == true) && (this->warningsAsErrors == true)) {
    Reporter::fatal_usage<char_const(&)[35],char_const*&,char_const*&>
              (report,(char (*) [35])"Cannot specify both --{} and --{}.",&kQuiet,&kWarningsAsErrors
              );
  }
  return;
}

Assistant:

void CommandDeflate::Options::process(cxxopts::Options&,
                                             cxxopts::ParseResult& args,
                                             Reporter& report) {
    quiet = args[kQuiet].as<bool>();
    warningsAsErrors = args[kWarningsAsErrors].as<bool>();
    if (quiet && warningsAsErrors) {
        report.fatal_usage("Cannot specify both --{} and --{}.",
                           this->kQuiet, this->kWarningsAsErrors);
    }
}